

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nested.cpp
# Opt level: O0

tuple<NS_*> test_graphs::exelixis_python_solution(void)

{
  char *pcVar1;
  NS *this;
  void *pvVar2;
  _Tuple_impl<0UL,_NS_*> in_RDI;
  type *solver_n;
  type *parser_n;
  type *solution_context_n;
  type *problem_context_n;
  NS *universe;
  type *fs49;
  type *fs48;
  type *fs47;
  type *fs46;
  type *fs45;
  type *fs44;
  type *fs43;
  type *fs42;
  type *fs41;
  type *fs40;
  type *fs39;
  type *fs38;
  type *fs37;
  type *fs36;
  type *fs35;
  type *fs34;
  type *fs33;
  type *fs32;
  type *fs31;
  type *fs30;
  type *fs23;
  type *fs22;
  type *fs21;
  type *fs20;
  type *fs10;
  type *fs01;
  type *fs00;
  type *solver;
  NS *solver_g;
  type *ps43;
  type *ps42;
  type *ps41;
  type *ps40;
  type *ps33;
  type *ps32;
  type *ps31;
  type *ps30;
  type *ps21;
  type *ps20;
  type *ps10;
  type *ps02;
  type *ps01;
  type *ps00;
  type *parser;
  type *ps4;
  type *ps3;
  type *ps2;
  type *ps1;
  type *ps0;
  NS *parser_g;
  type *swapo;
  type *applyo;
  type *fixo;
  type *mapo;
  type *matcheso;
  type *filtero;
  type *joino;
  type *heado;
  type *chaino;
  type *somo;
  type *mulo;
  type *alto;
  type *seqo;
  type *arga;
  type *anyofa;
  type *thirda;
  type *seconda;
  type *firsta;
  type *evaluator_ops_n;
  type *parser_ops_n;
  NS *evaluator_ops_g;
  NS *parser_ops_g;
  NS *solution_context_g;
  type *fdiv;
  type *fmul;
  type *fsub;
  type *fadd;
  type *fint;
  type *sempty;
  type *srparen;
  type *slparen;
  type *s9;
  type *s8;
  type *s7;
  type *s6;
  type *s5;
  type *s4;
  type *s3;
  type *s2;
  type *s1;
  type *s0;
  type *sneg;
  type *sdiv;
  type *stimes;
  type *smin;
  type *splus;
  type *hasi;
  type *hass;
  type *hasf;
  type *symbolc;
  type *parenthesec;
  type *operatorc;
  type *digitc;
  NS *problem_context_g;
  char *pcVar3;
  char *in_stack_ffffffffffffeee0;
  char *pcVar4;
  char *in_stack_ffffffffffffeee8;
  char *pcVar5;
  char *in_stack_ffffffffffffeef0;
  char *pcVar6;
  NS *in_stack_ffffffffffffeef8;
  char *pcVar7;
  char *in_stack_ffffffffffffef00;
  char *pcVar8;
  NS *in_stack_ffffffffffffef08;
  char *this_00;
  char *first;
  NS *this_01;
  char *first_00;
  NS *in_stack_ffffffffffffef28;
  char *in_stack_ffffffffffffef30;
  char *in_stack_ffffffffffffef38;
  char *in_stack_ffffffffffffef40;
  char *in_stack_ffffffffffffef48;
  NS *in_stack_ffffffffffffef50;
  char *in_stack_ffffffffffffef70;
  char *rest_5;
  char *rest_6;
  char *rest_7;
  char *rest;
  char *first_01;
  char *in_stack_ffffffffffffefe8;
  char *in_stack_ffffffffffffeff0;
  char *in_stack_ffffffffffffeff8;
  char *in_stack_fffffffffffff000;
  NS *in_stack_fffffffffffff008;
  char *in_stack_fffffffffffff010;
  char *in_stack_fffffffffffff018;
  char *in_stack_fffffffffffff020;
  char *in_stack_fffffffffffff028;
  char *in_stack_fffffffffffff030;
  char *in_stack_fffffffffffff038;
  __tuple_element_t<24UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_fb8;
  char *in_stack_fffffffffffff050;
  char *in_stack_fffffffffffff058;
  char *in_stack_fffffffffffff060;
  char *in_stack_fffffffffffff068;
  char *in_stack_fffffffffffff070;
  char *in_stack_fffffffffffff078;
  char *in_stack_fffffffffffff080;
  char *in_stack_fffffffffffff088;
  char *in_stack_fffffffffffff090;
  char *in_stack_fffffffffffff098;
  char *in_stack_fffffffffffff0a0;
  char *in_stack_fffffffffffff0a8;
  char *in_stack_fffffffffffff0b0;
  char *in_stack_fffffffffffff0b8;
  char *in_stack_fffffffffffff0c0;
  char *in_stack_fffffffffffff0c8;
  char *in_stack_fffffffffffff0d0;
  NS *in_stack_fffffffffffff0d8;
  __tuple_element_t<20UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_f10;
  sockaddr *local_f08;
  undefined8 local_f00;
  __tuple_element_t<19UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_ef8;
  sockaddr *local_ef0;
  undefined8 local_ee8;
  char *in_stack_fffffffffffff120;
  char *in_stack_fffffffffffff128;
  char *in_stack_fffffffffffff130;
  char *in_stack_fffffffffffff138;
  char *in_stack_fffffffffffff140;
  char *in_stack_fffffffffffff148;
  char *in_stack_fffffffffffff150;
  char *in_stack_fffffffffffff158;
  char *in_stack_fffffffffffff160;
  char *in_stack_fffffffffffff168;
  char *in_stack_fffffffffffff170;
  char *in_stack_fffffffffffff178;
  char *in_stack_fffffffffffff180;
  char *in_stack_fffffffffffff188;
  char *in_stack_fffffffffffff190;
  char *in_stack_fffffffffffff198;
  char *in_stack_fffffffffffff1a0;
  char *in_stack_fffffffffffff1a8;
  char *in_stack_fffffffffffff1b0;
  char *in_stack_fffffffffffff1b8;
  char *in_stack_fffffffffffff1c0;
  char *in_stack_fffffffffffff1c8;
  char *in_stack_fffffffffffff1d0;
  __tuple_element_t<3UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_e20;
  sockaddr *local_e18;
  undefined8 local_e10;
  __tuple_element_t<3UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*>_> local_e08;
  sockaddr *local_e00;
  undefined8 local_df8;
  __tuple_element_t<2UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_df0;
  sockaddr *local_de8;
  undefined8 local_de0;
  __tuple_element_t<11UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_dd8;
  sockaddr *local_dd0;
  undefined8 local_dc8;
  __tuple_element_t<10UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_dc0;
  sockaddr *local_db8;
  undefined8 local_db0;
  __tuple_element_t<9UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_da8;
  sockaddr *local_da0;
  undefined8 local_d98;
  __tuple_element_t<16UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_d90;
  sockaddr *local_d88;
  undefined8 local_d80;
  __tuple_element_t<12UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_d78;
  sockaddr *local_d70;
  undefined8 local_d68;
  __tuple_element_t<8UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_d60;
  sockaddr *local_d58;
  undefined8 local_d50;
  __tuple_element_t<7UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_d48;
  sockaddr *local_d40;
  undefined8 local_d38;
  __tuple_element_t<16UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_d30;
  sockaddr *local_d28;
  undefined8 local_d20;
  __tuple_element_t<15UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_d18;
  sockaddr *local_d10;
  undefined8 local_d08;
  __tuple_element_t<6UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_d00;
  sockaddr *local_cf8;
  undefined8 local_cf0;
  __tuple_element_t<5UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_ce8;
  sockaddr *local_ce0;
  undefined8 local_cd8;
  __tuple_element_t<4UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_cd0;
  sockaddr *local_cc8;
  undefined8 local_cc0;
  __tuple_element_t<3UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_cb8;
  sockaddr *local_cb0;
  undefined8 local_ca8;
  __tuple_element_t<2UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_ca0;
  sockaddr *local_c98;
  undefined8 local_c90;
  __tuple_element_t<17UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_c88;
  sockaddr *local_c80;
  undefined8 local_c78;
  __tuple_element_t<0UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*>_> local_c70;
  sockaddr *local_c68;
  undefined8 local_c60;
  __tuple_element_t<1UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_c58;
  sockaddr *local_c50;
  undefined8 local_c48;
  __tuple_element_t<0UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_c40;
  sockaddr *local_c38;
  undefined8 local_c30;
  __tuple_element_t<14UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_c28;
  __tuple_element_t<24UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_c20;
  sockaddr *local_c18;
  undefined8 local_c10;
  __tuple_element_t<15UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_c08;
  __tuple_element_t<25UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_c00;
  sockaddr *local_bf8;
  undefined8 local_bf0;
  __tuple_element_t<12UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_be8;
  __tuple_element_t<22UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_be0;
  sockaddr *local_bd8;
  undefined8 local_bd0;
  __tuple_element_t<8UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_bc8;
  __tuple_element_t<18UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_bc0;
  sockaddr *local_bb8;
  undefined8 local_bb0;
  __tuple_element_t<10UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_ba8;
  __tuple_element_t<20UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_ba0;
  __tuple_element_t<11UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_b98;
  __tuple_element_t<21UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_b90;
  sockaddr *local_b88;
  undefined8 local_b80;
  __tuple_element_t<4UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_b78;
  __tuple_element_t<5UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_b70;
  sockaddr *local_b68;
  undefined8 local_b60;
  __tuple_element_t<1UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_b58;
  sockaddr *local_b50;
  undefined8 local_b48;
  __tuple_element_t<2UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_b40;
  __tuple_element_t<6UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_b38;
  __tuple_element_t<16UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_b30;
  __tuple_element_t<26UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_b28;
  sockaddr *local_b20;
  undefined8 local_b18;
  __tuple_element_t<0UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_b10;
  __tuple_element_t<3UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_b08;
  __tuple_element_t<7UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_b00;
  __tuple_element_t<17UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_af8;
  __tuple_element_t<9UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_af0;
  __tuple_element_t<19UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_ae8;
  __tuple_element_t<13UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_ae0;
  __tuple_element_t<23UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_ad8;
  sockaddr *local_ad0;
  undefined8 local_ac8;
  __tuple_element_t<26UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  *local_ac0;
  __tuple_element_t<25UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  *local_ab8;
  __tuple_element_t<24UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  *local_ab0;
  __tuple_element_t<23UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  *local_aa8;
  __tuple_element_t<22UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  *local_aa0;
  __tuple_element_t<21UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  *local_a98;
  __tuple_element_t<20UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  *local_a90;
  __tuple_element_t<19UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  *local_a88;
  __tuple_element_t<18UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  *local_a80;
  __tuple_element_t<17UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  *local_a78;
  __tuple_element_t<16UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  *local_a70;
  __tuple_element_t<15UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  *local_a68;
  __tuple_element_t<14UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  *local_a60;
  __tuple_element_t<13UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  *local_a58;
  __tuple_element_t<12UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  *local_a50;
  __tuple_element_t<11UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  *local_a48;
  __tuple_element_t<10UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  *local_a40;
  __tuple_element_t<9UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  *local_a38;
  __tuple_element_t<8UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  *local_a30;
  __tuple_element_t<7UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  *local_a28;
  __tuple_element_t<6UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  *local_a20;
  __tuple_element_t<5UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  *local_a18;
  __tuple_element_t<4UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  *local_a10;
  __tuple_element_t<3UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  *local_a08;
  __tuple_element_t<2UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  *local_a00;
  __tuple_element_t<1UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  *local_9f8;
  __tuple_element_t<0UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  *local_9f0;
  __tuple_element_t<0UL,_tuple<N_*>_> *local_910;
  void *local_900;
  __tuple_element_t<0UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_8f8;
  __tuple_element_t<1UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_8f0;
  sockaddr *local_8e8;
  undefined8 local_8e0;
  __tuple_element_t<3UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_> local_8d8;
  sockaddr *local_8d0;
  undefined8 local_8c8;
  __tuple_element_t<13UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_8c0;
  sockaddr *local_8b8;
  undefined8 local_8b0;
  __tuple_element_t<12UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_8a8;
  sockaddr *local_8a0;
  undefined8 local_898;
  __tuple_element_t<11UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_890;
  sockaddr *local_888;
  undefined8 local_880;
  __tuple_element_t<3UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_> local_878;
  sockaddr *local_870;
  undefined8 local_868;
  __tuple_element_t<10UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_860;
  sockaddr *local_858;
  undefined8 local_850;
  __tuple_element_t<2UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_848;
  __tuple_element_t<3UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_840;
  sockaddr *local_838;
  undefined8 local_830;
  __tuple_element_t<2UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_> local_828;
  sockaddr *local_820;
  undefined8 local_818;
  __tuple_element_t<9UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_810;
  sockaddr *local_808;
  undefined8 local_800;
  __tuple_element_t<8UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_7f8;
  sockaddr *local_7f0;
  undefined8 local_7e8;
  __tuple_element_t<7UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_7e0;
  sockaddr *local_7d8;
  undefined8 local_7d0;
  __tuple_element_t<2UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_> local_7c8;
  sockaddr *local_7c0;
  undefined8 local_7b8;
  __tuple_element_t<6UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_7b0;
  sockaddr *local_7a8;
  undefined8 local_7a0;
  __tuple_element_t<16UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_798;
  sockaddr *local_790;
  undefined8 local_788;
  __tuple_element_t<4UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_> local_780;
  sockaddr *local_778;
  undefined8 local_770;
  __tuple_element_t<15UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_768;
  sockaddr *local_760;
  undefined8 local_758;
  __tuple_element_t<5UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_750;
  __tuple_element_t<0UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_> local_748;
  sockaddr *local_740;
  undefined8 local_738;
  __tuple_element_t<4UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_730;
  sockaddr *local_728;
  undefined8 local_720;
  __tuple_element_t<5UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_718;
  __tuple_element_t<6UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_710;
  __tuple_element_t<7UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_708;
  __tuple_element_t<8UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_700;
  __tuple_element_t<9UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_6f8;
  __tuple_element_t<10UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_6f0;
  __tuple_element_t<11UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_6e8;
  __tuple_element_t<12UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_6e0;
  __tuple_element_t<13UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_6d8;
  __tuple_element_t<14UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_6d0;
  sockaddr *local_6c8;
  undefined8 local_6c0;
  __tuple_element_t<3UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_6b8;
  sockaddr *local_6b0;
  undefined8 local_6a8;
  __tuple_element_t<1UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_> local_6a0;
  sockaddr *local_698;
  undefined8 local_690;
  __tuple_element_t<2UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_688;
  sockaddr *local_680;
  undefined8 local_678;
  __tuple_element_t<4UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_670;
  __tuple_element_t<17UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_668;
  sockaddr *local_660;
  undefined8 local_658;
  __tuple_element_t<1UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_650;
  sockaddr *local_648;
  undefined8 local_640;
  __tuple_element_t<0UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_638;
  sockaddr *local_630;
  undefined8 local_628;
  __tuple_element_t<7UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_620;
  __tuple_element_t<11UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_618;
  sockaddr *local_610;
  undefined8 local_608;
  __tuple_element_t<2UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_600;
  sockaddr *local_5f8;
  undefined8 local_5f0;
  __tuple_element_t<1UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_5e8;
  __tuple_element_t<3UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_5e0;
  __tuple_element_t<4UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_5d8;
  __tuple_element_t<9UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_5d0;
  __tuple_element_t<13UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_5c8;
  sockaddr *local_5c0;
  undefined8 local_5b8;
  __tuple_element_t<0UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_5b0;
  __tuple_element_t<5UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_5a8;
  __tuple_element_t<6UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_5a0;
  __tuple_element_t<8UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_598;
  __tuple_element_t<10UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_590;
  __tuple_element_t<12UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_588;
  sockaddr *local_580;
  undefined8 local_578;
  __tuple_element_t<13UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  *local_570;
  __tuple_element_t<12UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  *local_568;
  __tuple_element_t<11UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  *local_560;
  __tuple_element_t<10UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  *local_558;
  __tuple_element_t<9UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  *local_550;
  __tuple_element_t<8UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  *local_548;
  __tuple_element_t<7UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  *local_540;
  __tuple_element_t<6UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  *local_538;
  __tuple_element_t<5UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  *local_530;
  __tuple_element_t<4UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  *local_528;
  __tuple_element_t<3UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  *local_520;
  __tuple_element_t<2UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  *local_518;
  __tuple_element_t<1UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  *local_510;
  __tuple_element_t<0UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  *local_508;
  __tuple_element_t<5UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_> *local_490;
  __tuple_element_t<4UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_> *local_488;
  __tuple_element_t<3UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_> *local_480;
  __tuple_element_t<2UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_> *local_478;
  __tuple_element_t<1UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_> *local_470;
  __tuple_element_t<0UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_> *local_468;
  void *local_430;
  __tuple_element_t<8UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_> *local_428;
  __tuple_element_t<7UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_> *local_420;
  __tuple_element_t<6UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_> *local_418;
  __tuple_element_t<5UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_> *local_410;
  __tuple_element_t<4UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_> *local_408;
  __tuple_element_t<3UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_> *local_400;
  __tuple_element_t<2UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_> *local_3f8;
  __tuple_element_t<1UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_> *local_3f0;
  __tuple_element_t<0UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_> *local_3e8;
  __tuple_element_t<3UL,_tuple<N_*,_N_*,_N_*,_N_*>_> *local_398;
  __tuple_element_t<2UL,_tuple<N_*,_N_*,_N_*,_N_*>_> *local_390;
  __tuple_element_t<1UL,_tuple<N_*,_N_*,_N_*,_N_*>_> *local_388;
  __tuple_element_t<0UL,_tuple<N_*,_N_*,_N_*,_N_*>_> *local_380;
  __tuple_element_t<4UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*>_> *local_358;
  __tuple_element_t<3UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*>_> *local_350;
  __tuple_element_t<2UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*>_> *local_348;
  __tuple_element_t<1UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*>_> *local_340;
  __tuple_element_t<0UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*>_> *local_338;
  __tuple_element_t<1UL,_tuple<N_*,_N_*>_> *local_308;
  __tuple_element_t<0UL,_tuple<N_*,_N_*>_> *local_300;
  void *local_2e8;
  void *local_2e0;
  NS *local_2d8;
  __tuple_element_t<4UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*>_> local_2d0;
  sockaddr *local_2c8;
  undefined8 local_2c0;
  __tuple_element_t<3UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*>_> local_2b8;
  sockaddr *local_2b0;
  undefined8 local_2a8;
  __tuple_element_t<2UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*>_> local_2a0;
  sockaddr *local_298;
  undefined8 local_290;
  __tuple_element_t<1UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*>_> local_288;
  sockaddr *local_280;
  undefined8 local_278;
  __tuple_element_t<15UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_270;
  __tuple_element_t<16UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_268;
  sockaddr *local_260;
  undefined8 local_258;
  __tuple_element_t<0UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_250;
  __tuple_element_t<1UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_248;
  __tuple_element_t<2UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_240;
  __tuple_element_t<3UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  local_238;
  sockaddr *local_230;
  undefined8 local_228;
  __tuple_element_t<4UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*>_> *local_220;
  __tuple_element_t<3UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*>_> *local_218;
  __tuple_element_t<2UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*>_> *local_210;
  __tuple_element_t<1UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*>_> *local_208;
  __tuple_element_t<0UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*>_> *local_200;
  __tuple_element_t<17UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  *local_1d0;
  __tuple_element_t<16UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  *local_1c8;
  __tuple_element_t<15UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  *local_1c0;
  __tuple_element_t<14UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  *local_1b8;
  __tuple_element_t<13UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  *local_1b0;
  __tuple_element_t<12UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  *local_1a8;
  __tuple_element_t<11UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  *local_1a0;
  __tuple_element_t<10UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  *local_198;
  __tuple_element_t<9UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  *local_190;
  __tuple_element_t<8UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  *local_188;
  __tuple_element_t<7UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  *local_180;
  __tuple_element_t<6UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  *local_178;
  __tuple_element_t<5UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  *local_170;
  __tuple_element_t<4UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  *local_168;
  __tuple_element_t<3UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  *local_160;
  __tuple_element_t<2UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  *local_158;
  __tuple_element_t<1UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  *local_150;
  __tuple_element_t<0UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>_>
  *local_148;
  __tuple_element_t<2UL,_tuple<N_*,_N_*,_N_*>_> *local_b0;
  __tuple_element_t<1UL,_tuple<N_*,_N_*,_N_*>_> *local_a8;
  __tuple_element_t<0UL,_tuple<N_*,_N_*,_N_*>_> *local_a0;
  __tuple_element_t<3UL,_tuple<N_*,_N_*,_N_*,_N_*>_> *local_80;
  __tuple_element_t<2UL,_tuple<N_*,_N_*,_N_*,_N_*>_> *local_78;
  __tuple_element_t<1UL,_tuple<N_*,_N_*,_N_*,_N_*>_> *local_70;
  __tuple_element_t<0UL,_tuple<N_*,_N_*,_N_*,_N_*>_> *local_68;
  char *local_40;
  
  pcVar1 = (char *)operator_new(0x18);
  memset(pcVar1,0,0x18);
  NS::NS((NS *)0x1a594a);
  local_40 = pcVar1;
  NS::wrap<char_const*,char_const*,char_const*,char_const*>
            (in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,(char *)in_stack_ffffffffffffeef8,
             in_stack_ffffffffffffeef0,in_stack_ffffffffffffeee8);
  local_68 = std::get<0ul,N*,N*,N*,N*>((tuple<N_*,_N_*,_N_*,_N_*> *)0x1a5998);
  local_70 = std::get<1ul,N*,N*,N*,N*>((tuple<N_*,_N_*,_N_*,_N_*> *)0x1a59ad);
  local_78 = std::get<2ul,N*,N*,N*,N*>((tuple<N_*,_N_*,_N_*,_N_*> *)0x1a59c2);
  local_80 = std::get<3ul,N*,N*,N*,N*>((tuple<N_*,_N_*,_N_*,_N_*> *)0x1a59d7);
  NS::wrap<char_const*,char_const*,char_const*>
            (in_stack_ffffffffffffeef8,in_stack_ffffffffffffeef0,in_stack_ffffffffffffeee8,
             in_stack_ffffffffffffeee0);
  local_a0 = std::get<0ul,N*,N*,N*>((tuple<N_*,_N_*,_N_*> *)0x1a5a16);
  local_a8 = std::get<1ul,N*,N*,N*>((tuple<N_*,_N_*,_N_*> *)0x1a5a2b);
  local_b0 = std::get<2ul,N*,N*,N*>((tuple<N_*,_N_*,_N_*> *)0x1a5a40);
  rest_5 = "0";
  rest_6 = "1";
  rest_7 = "2";
  rest = "3";
  first_01 = " ";
  pcVar3 = "3";
  pcVar4 = "4";
  pcVar5 = "5";
  pcVar6 = "6";
  pcVar7 = "7";
  pcVar8 = "8";
  this_00 = "9";
  first = "(";
  this_01 = (NS *)0x1d11f7;
  first_00 = " ";
  NS::
  wrap<char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*>
            (in_stack_fffffffffffff008,in_stack_fffffffffffff000,in_stack_ffffffffffffeff8,
             in_stack_ffffffffffffeff0,in_stack_ffffffffffffefe8,in_stack_fffffffffffff050,
             in_stack_fffffffffffff058,in_stack_fffffffffffff060,in_stack_fffffffffffff068,
             in_stack_fffffffffffff070,in_stack_fffffffffffff078,in_stack_fffffffffffff080,
             in_stack_fffffffffffff088,in_stack_fffffffffffff090,in_stack_fffffffffffff098,
             in_stack_fffffffffffff0a0,in_stack_fffffffffffff0a8,in_stack_fffffffffffff0b0,
             in_stack_fffffffffffff0b8);
  local_148 = std::get<0ul,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*>
                        ((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                          *)0x1a5b79);
  local_150 = std::get<1ul,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*>
                        ((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                          *)0x1a5b8e);
  local_158 = std::get<2ul,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*>
                        ((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                          *)0x1a5ba3);
  local_160 = std::get<3ul,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*>
                        ((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                          *)0x1a5bb8);
  local_168 = std::get<4ul,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*>
                        ((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                          *)0x1a5bcd);
  local_170 = std::get<5ul,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*>
                        ((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                          *)0x1a5be2);
  local_178 = std::get<6ul,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*>
                        ((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                          *)0x1a5bf7);
  local_180 = std::get<7ul,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*>
                        ((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                          *)0x1a5c0c);
  local_188 = std::get<8ul,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*>
                        ((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                          *)0x1a5c21);
  local_190 = std::get<9ul,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*>
                        ((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                          *)0x1a5c36);
  local_198 = std::get<10ul,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*>
                        ((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                          *)0x1a5c4b);
  local_1a0 = std::get<11ul,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*>
                        ((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                          *)0x1a5c60);
  local_1a8 = std::get<12ul,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*>
                        ((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                          *)0x1a5c75);
  local_1b0 = std::get<13ul,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*>
                        ((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                          *)0x1a5c8a);
  local_1b8 = std::get<14ul,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*>
                        ((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                          *)0x1a5c9f);
  local_1c0 = std::get<15ul,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*>
                        ((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                          *)0x1a5cb4);
  local_1c8 = std::get<16ul,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*>
                        ((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                          *)0x1a5cc9);
  local_1d0 = std::get<17ul,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*>
                        ((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                          *)0x1a5cde);
  NS::wrap<char_const*,char_const*,char_const*,char_const*,char_const*>
            (this_01,first,this_00,pcVar8,pcVar7,in_stack_ffffffffffffef30);
  local_200 = std::get<0ul,N*,N*,N*,N*,N*>((tuple<N_*,_N_*,_N_*,_N_*,_N_*> *)0x1a5d2f);
  local_208 = std::get<1ul,N*,N*,N*,N*,N*>((tuple<N_*,_N_*,_N_*,_N_*,_N_*> *)0x1a5d44);
  local_210 = std::get<2ul,N*,N*,N*,N*,N*>((tuple<N_*,_N_*,_N_*,_N_*,_N_*> *)0x1a5d59);
  local_218 = std::get<3ul,N*,N*,N*,N*,N*>((tuple<N_*,_N_*,_N_*,_N_*,_N_*> *)0x1a5d6e);
  local_220 = std::get<4ul,N*,N*,N*,N*,N*>((tuple<N_*,_N_*,_N_*,_N_*,_N_*> *)0x1a5d83);
  local_250 = *local_148;
  local_248 = *local_150;
  local_240 = *local_158;
  local_238 = *local_160;
  local_230 = (sockaddr *)&local_250;
  local_228 = 4;
  N::connect(*local_70,(int)*local_b0,local_230,4);
  local_270 = *local_1c0;
  local_268 = *local_1c8;
  local_260 = (sockaddr *)&local_270;
  local_258 = 2;
  N::connect(*local_78,(int)*local_b0,local_260,2);
  local_288 = *local_208;
  local_280 = (sockaddr *)&local_288;
  local_278 = 1;
  N::connect(*local_148,(int)*local_a0,local_280,1);
  local_2a0 = *local_210;
  local_298 = (sockaddr *)&local_2a0;
  local_290 = 1;
  N::connect(*local_150,(int)*local_a0,local_298,1);
  local_2b8 = *local_218;
  local_2b0 = (sockaddr *)&local_2b8;
  local_2a8 = 1;
  N::connect(*local_158,(int)*local_a0,local_2b0,1);
  local_2d0 = *local_220;
  local_2c8 = (sockaddr *)&local_2d0;
  local_2c0 = 1;
  N::connect(*local_160,(int)*local_a0,local_2c8,1);
  this = (NS *)operator_new(0x18);
  memset(this,0,0x18);
  NS::NS((NS *)0x1a6021);
  local_2d8 = this;
  pvVar2 = operator_new(0x18);
  memset(pvVar2,0,0x18);
  NS::NS((NS *)0x1a605f);
  local_2e0 = pvVar2;
  pvVar2 = operator_new(0x18);
  memset(pvVar2,0,0x18);
  NS::NS((NS *)0x1a609d);
  local_2e8 = pvVar2;
  NS::wrap<NS*,NS*>((NS *)pcVar5,(NS *)pcVar4,(NS *)pcVar3);
  local_300 = std::get<0ul,N*,N*>((tuple<N_*,_N_*> *)0x1a60df);
  local_308 = std::get<1ul,N*,N*>((tuple<N_*,_N_*> *)0x1a60f4);
  NS::wrap<char_const*,char_const*,char_const*,char_const*,char_const*>
            (this_01,first,this_00,pcVar8,pcVar7,in_stack_ffffffffffffef30);
  local_338 = std::get<0ul,N*,N*,N*,N*,N*>((tuple<N_*,_N_*,_N_*,_N_*,_N_*> *)0x1a6145);
  local_340 = std::get<1ul,N*,N*,N*,N*,N*>((tuple<N_*,_N_*,_N_*,_N_*,_N_*> *)0x1a615a);
  local_348 = std::get<2ul,N*,N*,N*,N*,N*>((tuple<N_*,_N_*,_N_*,_N_*,_N_*> *)0x1a616f);
  local_350 = std::get<3ul,N*,N*,N*,N*,N*>((tuple<N_*,_N_*,_N_*,_N_*,_N_*> *)0x1a6184);
  local_358 = std::get<4ul,N*,N*,N*,N*,N*>((tuple<N_*,_N_*,_N_*,_N_*,_N_*> *)0x1a6199);
  NS::wrap<char_const*,char_const*,char_const*,char_const*>
            ((NS *)this_00,pcVar8,pcVar7,pcVar6,pcVar5);
  local_380 = std::get<0ul,N*,N*,N*,N*>((tuple<N_*,_N_*,_N_*,_N_*> *)0x1a61df);
  local_388 = std::get<1ul,N*,N*,N*,N*>((tuple<N_*,_N_*,_N_*,_N_*> *)0x1a61f4);
  local_390 = std::get<2ul,N*,N*,N*,N*>((tuple<N_*,_N_*,_N_*,_N_*> *)0x1a6209);
  local_398 = std::get<3ul,N*,N*,N*,N*>((tuple<N_*,_N_*,_N_*,_N_*> *)0x1a621e);
  NS::
  wrap<char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*>
            (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,
             in_stack_ffffffffffffef38,in_stack_ffffffffffffef30,in_stack_ffffffffffffef70,pcVar1,
             rest_5,rest_6,rest_7);
  local_3e8 = std::get<0ul,N*,N*,N*,N*,N*,N*,N*,N*,N*>
                        ((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*> *)0x1a629f);
  local_3f0 = std::get<1ul,N*,N*,N*,N*,N*,N*,N*,N*,N*>
                        ((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*> *)0x1a62b4);
  local_3f8 = std::get<2ul,N*,N*,N*,N*,N*,N*,N*,N*,N*>
                        ((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*> *)0x1a62c9);
  local_400 = std::get<3ul,N*,N*,N*,N*,N*,N*,N*,N*,N*>
                        ((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*> *)0x1a62de);
  local_408 = std::get<4ul,N*,N*,N*,N*,N*,N*,N*,N*,N*>
                        ((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*> *)0x1a62f3);
  local_410 = std::get<5ul,N*,N*,N*,N*,N*,N*,N*,N*,N*>
                        ((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*> *)0x1a6308);
  local_418 = std::get<6ul,N*,N*,N*,N*,N*,N*,N*,N*,N*>
                        ((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*> *)0x1a631d);
  local_420 = std::get<7ul,N*,N*,N*,N*,N*,N*,N*,N*,N*>
                        ((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*> *)0x1a6332);
  local_428 = std::get<8ul,N*,N*,N*,N*,N*,N*,N*,N*,N*>
                        ((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*> *)0x1a6347);
  pvVar2 = operator_new(0x18);
  memset(pvVar2,0,0x18);
  NS::NS((NS *)0x1a637d);
  local_430 = pvVar2;
  NS::wrap<char_const*,char_const*,char_const*,char_const*,char_const*,char_const*>
            (in_stack_ffffffffffffef28,first_00,(char *)this_01,first,this_00,
             in_stack_ffffffffffffef40,in_stack_ffffffffffffef48);
  local_468 = std::get<0ul,N*,N*,N*,N*,N*,N*>((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*> *)0x1a63e2);
  local_470 = std::get<1ul,N*,N*,N*,N*,N*,N*>((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*> *)0x1a63f7);
  local_478 = std::get<2ul,N*,N*,N*,N*,N*,N*>((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*> *)0x1a640c);
  local_480 = std::get<3ul,N*,N*,N*,N*,N*,N*>((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*> *)0x1a6421);
  local_488 = std::get<4ul,N*,N*,N*,N*,N*,N*>((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*> *)0x1a6436);
  local_490 = std::get<5ul,N*,N*,N*,N*,N*,N*>((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*> *)0x1a644b);
  pcVar1 = "mul";
  pcVar3 = "seq";
  NS::
  wrap<char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*>
            (this,first_01,rest,rest_7,rest_6,in_stack_ffffffffffffeff0,in_stack_ffffffffffffeff8,
             in_stack_fffffffffffff000,(char *)in_stack_fffffffffffff008,in_stack_fffffffffffff010,
             in_stack_fffffffffffff018,in_stack_fffffffffffff020,in_stack_fffffffffffff028,
             in_stack_fffffffffffff030,in_stack_fffffffffffff038);
  local_508 = std::get<0ul,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*>
                        ((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                          *)0x1a64cb);
  local_510 = std::get<1ul,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*>
                        ((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                          *)0x1a64e0);
  local_518 = std::get<2ul,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*>
                        ((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                          *)0x1a64f5);
  local_520 = std::get<3ul,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*>
                        ((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                          *)0x1a650a);
  local_528 = std::get<4ul,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*>
                        ((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                          *)0x1a651f);
  local_530 = std::get<5ul,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*>
                        ((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                          *)0x1a6534);
  local_538 = std::get<6ul,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*>
                        ((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                          *)0x1a6549);
  local_540 = std::get<7ul,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*>
                        ((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                          *)0x1a655e);
  local_548 = std::get<8ul,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*>
                        ((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                          *)0x1a6573);
  local_550 = std::get<9ul,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*>
                        ((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                          *)0x1a6588);
  local_558 = std::get<10ul,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*>
                        ((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                          *)0x1a659d);
  local_560 = std::get<11ul,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*>
                        ((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                          *)0x1a65b2);
  local_568 = std::get<12ul,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*>
                        ((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                          *)0x1a65c7);
  local_570 = std::get<13ul,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*>
                        ((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                          *)0x1a65dc);
  local_5b0 = *local_508;
  local_5a8 = *local_530;
  local_5a0 = *local_538;
  local_598 = *local_548;
  local_590 = *local_558;
  local_588 = *local_568;
  local_580 = (sockaddr *)&local_5b0;
  local_578 = 6;
  N::connect(*local_380,(int)*local_b0,local_580,6);
  local_5e8 = *local_510;
  local_5e0 = *local_520;
  local_5d8 = *local_528;
  local_5d0 = *local_550;
  local_5c8 = *local_570;
  local_5c0 = (sockaddr *)&local_5e8;
  local_5b8 = 5;
  N::connect(*local_388,(int)*local_b0,local_5c0,5);
  local_600 = *local_518;
  local_5f8 = (sockaddr *)&local_600;
  local_5f0 = 1;
  N::connect(*local_398,(int)*local_b0,local_5f8,1);
  local_620 = *local_540;
  local_618 = *local_560;
  local_610 = (sockaddr *)&local_620;
  local_608 = 2;
  N::connect(*local_390,(int)*local_b0,local_610,2);
  local_638 = *local_508;
  local_630 = (sockaddr *)&local_638;
  local_628 = 1;
  N::connect(*local_468,(int)*local_490,local_630,1);
  local_650 = *local_510;
  local_648 = (sockaddr *)&local_650;
  local_640 = 1;
  N::connect(*local_508,(int)*local_338,local_648,1);
  local_670 = *local_168;
  local_668 = *local_1d0;
  local_660 = (sockaddr *)&local_670;
  local_658 = 2;
  N::connect(*local_510,(int)*local_350,local_660,2);
  local_688 = *local_518;
  local_680 = (sockaddr *)&local_688;
  local_678 = 1;
  N::connect(*local_508,(int)*local_340,local_680,1);
  local_6a0 = *local_470;
  local_698 = (sockaddr *)&local_6a0;
  local_690 = 1;
  N::connect(*local_518,(int)*local_358,local_698,1);
  local_6b8 = *local_520;
  local_6b0 = (sockaddr *)&local_6b8;
  local_6a8 = 1;
  N::connect(*local_470,(int)*local_490,local_6b0,1);
  local_718 = *local_170;
  local_710 = *local_178;
  local_708 = *local_180;
  local_700 = *local_188;
  local_6f8 = *local_190;
  local_6f0 = *local_198;
  local_6e8 = *local_1a0;
  local_6e0 = *local_1a8;
  local_6d8 = *local_1b0;
  local_6d0 = *local_1b8;
  local_6c8 = (sockaddr *)&local_718;
  local_6c0 = 10;
  N::connect(*local_520,(int)*local_350,local_6c8,10);
  local_730 = *local_528;
  local_728 = (sockaddr *)&local_730;
  local_720 = 1;
  N::connect(*local_478,(int)*local_490,local_728,1);
  local_750 = *local_530;
  local_748 = *local_468;
  local_740 = (sockaddr *)&local_750;
  local_738 = 2;
  N::connect(*local_528,(int)*local_350,local_740,2);
  local_768 = *local_1c0;
  local_760 = (sockaddr *)&local_768;
  local_758 = 1;
  N::connect(*local_530,(int)*local_338,local_760,1);
  local_780 = *local_488;
  local_778 = (sockaddr *)&local_780;
  local_770 = 1;
  N::connect(*local_530,(int)*local_340,local_778,1);
  local_798 = *local_1c8;
  local_790 = (sockaddr *)&local_798;
  local_788 = 1;
  N::connect(*local_530,(int)*local_348,local_790,1);
  local_7b0 = *local_538;
  local_7a8 = (sockaddr *)&local_7b0;
  local_7a0 = 1;
  N::connect(*local_480,(int)*local_490,local_7a8,1);
  local_7c8 = *local_478;
  local_7c0 = (sockaddr *)&local_7c8;
  local_7b8 = 1;
  N::connect(*local_538,(int)*local_338,local_7c0,1);
  local_7e0 = *local_540;
  local_7d8 = (sockaddr *)&local_7e0;
  local_7d0 = 1;
  N::connect(*local_538,(int)*local_340,local_7d8,1);
  local_7f8 = *local_548;
  local_7f0 = (sockaddr *)&local_7f8;
  local_7e8 = 1;
  N::connect(*local_540,(int)*local_358,local_7f0,1);
  local_810 = *local_550;
  local_808 = (sockaddr *)&local_810;
  local_800 = 1;
  N::connect(*local_548,(int)*local_338,local_808,1);
  local_828 = *local_478;
  local_820 = (sockaddr *)&local_828;
  local_818 = 1;
  N::connect(*local_548,(int)*local_340,local_820,1);
  local_848 = *local_158;
  local_840 = *local_160;
  local_838 = (sockaddr *)&local_848;
  local_830 = 2;
  N::connect(*local_550,(int)*local_350,local_838,2);
  local_860 = *local_558;
  local_858 = (sockaddr *)&local_860;
  local_850 = 1;
  N::connect(*local_488,(int)*local_490,local_858,1);
  local_878 = *local_480;
  local_870 = (sockaddr *)&local_878;
  local_868 = 1;
  N::connect(*local_558,(int)*local_338,local_870,1);
  local_890 = *local_560;
  local_888 = (sockaddr *)&local_890;
  local_880 = 1;
  N::connect(*local_558,(int)*local_340,local_888,1);
  local_8a8 = *local_568;
  local_8a0 = (sockaddr *)&local_8a8;
  local_898 = 1;
  N::connect(*local_560,(int)*local_358,local_8a0,1);
  local_8c0 = *local_570;
  local_8b8 = (sockaddr *)&local_8c0;
  local_8b0 = 1;
  N::connect(*local_568,(int)*local_338,local_8b8,1);
  local_8d8 = *local_480;
  local_8d0 = (sockaddr *)&local_8d8;
  local_8c8 = 1;
  N::connect(*local_568,(int)*local_340,local_8d0,1);
  local_8f8 = *local_148;
  local_8f0 = *local_150;
  local_8e8 = (sockaddr *)&local_8f8;
  local_8e0 = 2;
  N::connect(*local_570,(int)*local_350,local_8e8,2);
  pvVar2 = operator_new(0x18);
  memset(pvVar2,0,0x18);
  NS::NS((NS *)0x1a7253);
  local_900 = pvVar2;
  NS::wrap<char_const*>((NS *)pcVar3,pcVar1);
  local_910 = std::get<0ul,N*>((tuple<N_*> *)0x1a728c);
  pcVar1 = "filter";
  pcVar3 = "filter";
  pcVar4 = "matches";
  pcVar5 = "matches";
  pcVar6 = "fix";
  pcVar7 = "chain";
  pcVar8 = "swap";
  NS::
  wrap<char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*>
            (in_stack_fffffffffffff0d8,in_stack_fffffffffffff0d0,in_stack_fffffffffffff0c8,
             in_stack_fffffffffffff0c0,in_stack_fffffffffffff0b8,in_stack_fffffffffffff120,
             in_stack_fffffffffffff128,in_stack_fffffffffffff130,in_stack_fffffffffffff138,
             in_stack_fffffffffffff140,in_stack_fffffffffffff148,in_stack_fffffffffffff150,
             in_stack_fffffffffffff158,in_stack_fffffffffffff160,in_stack_fffffffffffff168,
             in_stack_fffffffffffff170,in_stack_fffffffffffff178,in_stack_fffffffffffff180,
             in_stack_fffffffffffff188,in_stack_fffffffffffff190,in_stack_fffffffffffff198,
             in_stack_fffffffffffff1a0,in_stack_fffffffffffff1a8,in_stack_fffffffffffff1b0,
             in_stack_fffffffffffff1b8,in_stack_fffffffffffff1c0,in_stack_fffffffffffff1c8,
             in_stack_fffffffffffff1d0);
  local_9f0 = std::
              get<0ul,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*>
                        ((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                          *)0x1a7385);
  local_9f8 = std::
              get<1ul,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*>
                        ((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                          *)0x1a739a);
  local_a00 = std::
              get<2ul,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*>
                        ((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                          *)0x1a73af);
  local_a08 = std::
              get<3ul,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*>
                        ((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                          *)0x1a73c4);
  local_a10 = std::
              get<4ul,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*>
                        ((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                          *)0x1a73d9);
  local_a18 = std::
              get<5ul,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*>
                        ((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                          *)0x1a73ee);
  local_a20 = std::
              get<6ul,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*>
                        ((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                          *)0x1a7403);
  local_a28 = std::
              get<7ul,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*>
                        ((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                          *)0x1a7418);
  local_a30 = std::
              get<8ul,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*>
                        ((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                          *)0x1a742d);
  local_a38 = std::
              get<9ul,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*>
                        ((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                          *)0x1a7442);
  local_a40 = std::
              get<10ul,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*>
                        ((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                          *)0x1a7457);
  local_a48 = std::
              get<11ul,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*>
                        ((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                          *)0x1a746c);
  local_a50 = std::
              get<12ul,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*>
                        ((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                          *)0x1a7481);
  local_a58 = std::
              get<13ul,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*>
                        ((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                          *)0x1a7496);
  local_a60 = std::
              get<14ul,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*>
                        ((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                          *)0x1a74ab);
  local_a68 = std::
              get<15ul,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*>
                        ((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                          *)0x1a74c0);
  local_a70 = std::
              get<16ul,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*>
                        ((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                          *)0x1a74d5);
  local_a78 = std::
              get<17ul,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*>
                        ((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                          *)0x1a74ea);
  local_a80 = std::
              get<18ul,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*>
                        ((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                          *)0x1a74ff);
  local_a88 = std::
              get<19ul,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*>
                        ((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                          *)0x1a7514);
  local_a90 = std::
              get<20ul,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*>
                        ((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                          *)0x1a7529);
  local_a98 = std::
              get<21ul,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*>
                        ((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                          *)0x1a753e);
  local_aa0 = std::
              get<22ul,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*>
                        ((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                          *)0x1a7553);
  local_aa8 = std::
              get<23ul,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*>
                        ((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                          *)0x1a7568);
  local_ab0 = std::
              get<24ul,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*>
                        ((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                          *)0x1a757d);
  local_ab8 = std::
              get<25ul,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*>
                        ((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                          *)0x1a7592);
  local_ac0 = std::
              get<26ul,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*>
                        ((tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                          *)0x1a75a7);
  local_b10 = *local_9f0;
  local_b08 = *local_a08;
  local_b00 = *local_a28;
  local_af8 = *local_a78;
  local_af0 = *local_a38;
  local_ae8 = *local_a88;
  local_ae0 = *local_a58;
  local_ad8 = *local_aa8;
  local_ad0 = (sockaddr *)&local_b10;
  local_ac8 = 8;
  N::connect(*local_3e8,(int)*local_b0,local_ad0,8);
  local_b40 = *local_a00;
  local_b38 = *local_a20;
  local_b30 = *local_a70;
  local_b28 = *local_ac0;
  local_b20 = (sockaddr *)&local_b40;
  local_b18 = 4;
  N::connect(*local_3f0,(int)*local_b0,local_b20,4);
  local_b58 = *local_9f8;
  local_b50 = (sockaddr *)&local_b58;
  local_b48 = 1;
  N::connect(*local_3f8,(int)*local_b0,local_b50,1);
  local_b78 = *local_a10;
  local_b70 = *local_a18;
  local_b68 = (sockaddr *)&local_b78;
  local_b60 = 2;
  N::connect(*local_400,(int)*local_b0,local_b68,2);
  local_ba8 = *local_a40;
  local_ba0 = *local_a90;
  local_b98 = *local_a48;
  local_b90 = *local_a98;
  local_b88 = (sockaddr *)&local_ba8;
  local_b80 = 4;
  N::connect(*local_408,(int)*local_b0,local_b88,4);
  local_bc8 = *local_a30;
  local_bc0 = *local_a80;
  local_bb8 = (sockaddr *)&local_bc8;
  local_bb0 = 2;
  N::connect(*local_410,(int)*local_b0,local_bb8,2);
  local_be8 = *local_a50;
  local_be0 = *local_aa0;
  local_bd8 = (sockaddr *)&local_be8;
  local_bd0 = 2;
  N::connect(*local_418,(int)*local_b0,local_bd8,2);
  local_c08 = *local_a68;
  local_c00 = *local_ab8;
  local_bf8 = (sockaddr *)&local_c08;
  local_bf0 = 2;
  N::connect(*local_420,(int)*local_b0,local_bf8,2);
  local_c28 = *local_a60;
  local_c20 = *local_ab0;
  local_c18 = (sockaddr *)&local_c28;
  local_c10 = 2;
  N::connect(*local_428,(int)*local_b0,local_c18,2);
  local_c40 = *local_9f0;
  local_c38 = (sockaddr *)&local_c40;
  local_c30 = 1;
  N::connect(*local_468,(int)*local_910,local_c38,1);
  local_c58 = *local_9f8;
  local_c50 = (sockaddr *)&local_c58;
  local_c48 = 1;
  N::connect(*local_9f0,(int)*local_338,local_c50,1);
  local_c70 = *local_200;
  local_c68 = (sockaddr *)&local_c70;
  local_c60 = 1;
  N::connect(*local_9f0,(int)*local_340,local_c68,1);
  local_c88 = *local_1d0;
  local_c80 = (sockaddr *)&local_c88;
  local_c78 = 1;
  N::connect(*local_9f8,(int)*local_358,local_c80,1);
  local_ca0 = *local_a00;
  local_c98 = (sockaddr *)&local_ca0;
  local_c90 = 1;
  N::connect(*local_470,(int)*local_910,local_c98,1);
  local_cb8 = *local_a08;
  local_cb0 = (sockaddr *)&local_cb8;
  local_ca8 = 1;
  N::connect(*local_478,(int)*local_910,local_cb0,1);
  local_cd0 = *local_a10;
  local_cc8 = (sockaddr *)&local_cd0;
  local_cc0 = 1;
  N::connect(*local_a08,(int)*local_338,local_cc8,1);
  local_ce8 = *local_a18;
  local_ce0 = (sockaddr *)&local_ce8;
  local_cd8 = 1;
  N::connect(*local_a08,(int)*local_340,local_ce0,1);
  local_d00 = *local_a20;
  local_cf8 = (sockaddr *)&local_d00;
  local_cf0 = 1;
  N::connect(*local_a08,(int)*local_348,local_cf8,1);
  local_d18 = *local_1c0;
  local_d10 = (sockaddr *)&local_d18;
  local_d08 = 1;
  N::connect(*local_a10,(int)*local_358,local_d10,1);
  local_d30 = *local_1c8;
  local_d28 = (sockaddr *)&local_d30;
  local_d20 = 1;
  N::connect(*local_a18,(int)*local_358,local_d28,1);
  local_d48 = *local_a28;
  local_d40 = (sockaddr *)&local_d48;
  local_d38 = 1;
  N::connect(*local_480,(int)*local_910,local_d40,1);
  local_d60 = *local_a30;
  local_d58 = (sockaddr *)&local_d60;
  local_d50 = 1;
  N::connect(*local_a28,(int)*local_338,local_d58,1);
  local_d78 = *local_a50;
  local_d70 = (sockaddr *)&local_d78;
  local_d68 = 1;
  N::connect(*local_a28,(int)*local_340,local_d70,1);
  local_d90 = *local_a70;
  local_d88 = (sockaddr *)&local_d90;
  local_d80 = 1;
  N::connect(*local_a28,(int)*local_348,local_d88,1);
  local_da8 = *local_a38;
  local_da0 = (sockaddr *)&local_da8;
  local_d98 = 1;
  N::connect(*local_a30,(int)*local_358,local_da0,1);
  local_dc0 = *local_a40;
  local_db8 = (sockaddr *)&local_dc0;
  local_db0 = 1;
  N::connect(*local_a38,(int)*local_338,local_db8,1);
  local_dd8 = *local_a48;
  local_dd0 = (sockaddr *)&local_dd8;
  local_dc8 = 1;
  N::connect(*local_a38,(int)*local_340,local_dd0,1);
  local_df0 = *local_158;
  local_de8 = (sockaddr *)&local_df0;
  local_de0 = 1;
  N::connect(*local_a40,(int)*local_338,local_de8,1);
  local_e08 = *local_218;
  local_e00 = (sockaddr *)&local_e08;
  local_df8 = 1;
  N::connect(*local_a40,(int)*local_340,local_e00,1);
  local_e20 = *local_160;
  local_e18 = (sockaddr *)&local_e20;
  local_e10 = 1;
  N::connect(*local_a48,(int)*local_338,local_e18,1);
  N::connect(*local_a48,(int)*local_340,(sockaddr *)&stack0xfffffffffffff1c8,1);
  N::connect(*local_a50,(int)*local_358,(sockaddr *)&stack0xfffffffffffff1b0,1);
  N::connect(*local_a58,(int)*local_338,(sockaddr *)&stack0xfffffffffffff198,1);
  N::connect(*local_a58,(int)*local_340,(sockaddr *)&stack0xfffffffffffff180,1);
  N::connect(*local_488,(int)*local_910,(sockaddr *)&stack0xfffffffffffff168,1);
  N::connect(*local_a78,(int)*local_338,(sockaddr *)&stack0xfffffffffffff150,1);
  N::connect(*local_a78,(int)*local_340,(sockaddr *)&stack0xfffffffffffff138,1);
  N::connect(*local_a78,(int)*local_348,(sockaddr *)&stack0xfffffffffffff120,1);
  local_ef8 = *local_a88;
  local_ef0 = (sockaddr *)&local_ef8;
  local_ee8 = 1;
  N::connect(*local_a80,(int)*local_358,local_ef0,1);
  local_f10 = *local_a90;
  local_f08 = (sockaddr *)&local_f10;
  local_f00 = 1;
  N::connect(*local_a88,(int)*local_338,local_f08,1);
  N::connect(*local_a88,(int)*local_340,(sockaddr *)&stack0xfffffffffffff0d8,1);
  N::connect(*local_a90,(int)*local_338,(sockaddr *)&stack0xfffffffffffff0c0,1);
  N::connect(*local_a90,(int)*local_340,(sockaddr *)&stack0xfffffffffffff0a8,1);
  N::connect(*local_a98,(int)*local_338,(sockaddr *)&stack0xfffffffffffff090,1);
  N::connect(*local_a98,(int)*local_340,(sockaddr *)&stack0xfffffffffffff078,1);
  N::connect(*local_aa0,(int)*local_358,(sockaddr *)&stack0xfffffffffffff060,1);
  local_fb8 = *local_ab0;
  N::connect(*local_aa8,(int)*local_338,(sockaddr *)&local_fb8,1);
  N::connect(*local_aa8,(int)*local_340,(sockaddr *)&stack0xfffffffffffff030,1);
  pvVar2 = operator_new(0x18);
  memset(pvVar2,0,0x18);
  NS::NS((NS *)0x1a8813);
  NS::wrap<NS*,NS*,NS*,NS*>((NS *)pcVar8,(NS *)pcVar7,(NS *)pcVar6,(NS *)pcVar5,(NS *)pcVar4);
  std::get<0ul,N*,N*,N*,N*>((tuple<N_*,_N_*,_N_*,_N_*> *)0x1a8865);
  std::get<1ul,N*,N*,N*,N*>((tuple<N_*,_N_*,_N_*,_N_*> *)0x1a887a);
  std::get<2ul,N*,N*,N*,N*>((tuple<N_*,_N_*,_N_*,_N_*> *)0x1a888f);
  std::get<3ul,N*,N*,N*,N*>((tuple<N_*,_N_*,_N_*,_N_*> *)0x1a88a4);
  std::tuple<NS_*>::tuple<NS_*,_true,_true>((tuple<NS_*> *)pcVar3,(NS **)pcVar1);
  return (tuple<NS_*>)in_RDI.super__Head_base<0UL,_NS_*,_false>._M_head_impl;
}

Assistant:

std::tuple<NS*> exelixis_python_solution() {
        auto problem_context_g = new NS();
        auto [digitc, operatorc, parenthesec, symbolc] =
         problem_context_g->wrap("Digit", "Operator", "Parenthese", "Symbol");
        auto [hasf, hass, hasi] =
         problem_context_g->wrap("has function", "has symbol", "has instance");
        auto [splus, smin, stimes, sdiv, sneg, s0, s1, s2, s3, s4, s5, s6, s7, s8, s9, slparen, srparen, sempty] =
         problem_context_g->wrap("+", "-", "*", "/", "-", "0", "1", "2", "3", "4", "5", "6", "7", "8", "9", "(", ")", " ");
        auto [fint, fadd, fsub, fmul, fdiv] =
         problem_context_g->wrap("int", "add", "sub", "mul", "div");

        //digitc->connect(hasi, {s0, s1, s2, s3, s4, s5, s6, s7, s8, s9});
        operatorc->connect(hasi, {splus, smin, stimes, sdiv});
        parenthesec->connect(hasi, {slparen, srparen});
        //symbolc->connect(hasi, {splus, smin, stimes, sdiv, sneg, s0, s1, s2, s3, s4, s5, s6, s7, s8, s9, slparen, srparen, sempty});
        splus->connect(hasf, {fadd}); smin->connect(hasf, {fsub}); stimes->connect(hasf, {fmul}); sdiv->connect(hasf, {fdiv});

        auto solution_context_g = new NS(), parser_ops_g = new NS(), evaluator_ops_g = new NS();
        auto [parser_ops_n, evaluator_ops_n] =
         solution_context_g->wrap(parser_ops_g, evaluator_ops_g);

        auto [firsta, seconda, thirda, anyofa, arga] =
         solution_context_g->wrap("first", "second", "third", "any of", "arg");
        auto [seqo, alto, mulo, somo] =
         parser_ops_g->wrap("Sequence", "Either", "ZeroOrMore", "OneOrMore");
        auto [chaino, heado, joino, filtero, matcheso, mapo, fixo, applyo, swapo] =
         evaluator_ops_g->wrap("Chain", "Head", "Join", "Filter", "Matches", "Map", "Fix", "Apply", "Swap");

        auto parser_g = new NS();
        auto [ps0, ps1, ps2, ps3, ps4, parser] =
         parser_g->wrap("Integer", "Digit", "Factor", "Term", "Expression", "parser");
        auto [ps00, ps01, ps02, ps10, ps20, ps21, ps30, ps31, ps32, ps33, ps40, ps41, ps42, ps43] =
         parser_g->wrap("seq", "alt", "som", "alt", "alt", "seq", "seq", "mul", "seq", "alt", "seq", "mul", "seq", "alt");

        seqo->connect(hasi, {ps00, ps21, ps30, ps32, ps40, ps42});
        alto->connect(hasi, {ps01, ps10, ps20, ps33, ps43});
        somo->connect(hasi, {ps02});
        mulo->connect(hasi, {ps31, ps41});

        ps0->connect(parser, {ps00});
        ps00->connect(firsta, {ps01});
        ps01->connect(anyofa, {sneg, sempty});
        ps00->connect(seconda, {ps02});
        ps02->connect(arga, {ps1});

        ps1->connect(parser, {ps10});
        ps10->connect(anyofa, {s0, s1, s2, s3, s4, s5, s6, s7, s8, s9});

        ps2->connect(parser, {ps20});
        ps20->connect(anyofa, {ps21, ps0});
        ps21->connect(firsta, {slparen});
        ps21->connect(seconda, {ps4});
        ps21->connect(thirda, {srparen});

        ps3->connect(parser, {ps30});
        ps30->connect(firsta, {ps2});
        ps30->connect(seconda, {ps31});
        ps31->connect(arga, {ps32});
        ps32->connect(firsta, {ps33});
        ps32->connect(seconda, {ps2});
        ps33->connect(anyofa, {stimes, sdiv});

        ps4->connect(parser, {ps40});
        ps40->connect(firsta, {ps3});
        ps40->connect(seconda, {ps41});
        ps41->connect(arga, {ps42});
        ps42->connect(firsta, {ps43});
        ps42->connect(seconda, {ps3});
        ps43->connect(anyofa, {splus, smin});

        auto solver_g = new NS();
        auto [solver] =
         solver_g->wrap("solver");
        auto [fs00, fs01, fs10, fs20, fs21, fs22, fs23,
              fs30, fs31, fs32, fs33, fs34, fs35, fs36, fs37, fs38, fs39,
              fs40, fs41, fs42, fs43, fs44, fs45, fs46, fs47, fs48, fs49] =
         solver_g->wrap("chain", "join", "head", "chain", "filter", "filter", "head",
                 "chain", "map", "chain", "matches", "matches", "fix", "chain", "swap", "apply", "head",
                 "chain", "map", "chain", "matches", "matches", "fix", "chain", "swap", "apply", "head");

        chaino->connect(hasi, {fs00, fs20, fs30, fs40, fs32, fs42, fs36, fs46});
        heado->connect(hasi, {fs10, fs23, fs39, fs49});
        joino->connect(hasi, {fs01,});
        filtero->connect(hasi, {fs21, fs22,});
        matcheso->connect(hasi, {fs33, fs43, fs34, fs44});
        mapo->connect(hasi, {fs31, fs41,});
        fixo->connect(hasi, {fs35, fs45});
        applyo->connect(hasi, {fs38, fs48});
        swapo->connect(hasi, {fs37, fs47});

        ps0->connect(solver, {fs00});
        fs00->connect(firsta, {fs01});
        fs00->connect(seconda, {fint});
        fs01->connect(arga, {sempty});

        ps1->connect(solver, {fs10});

        ps2->connect(solver, {fs20});
        fs20->connect(firsta, {fs21});
        fs20->connect(seconda, {fs22});
        fs20->connect(thirda, {fs23});
        fs21->connect(arga, {slparen});
        fs22->connect(arga, {srparen});

        ps3->connect(solver, {fs30});
        fs30->connect(firsta, {fs31});
        fs30->connect(seconda, {fs35});
        fs30->connect(thirda, {fs39});
        fs31->connect(arga, {fs32});
        fs32->connect(firsta, {fs33});
        fs32->connect(seconda, {fs34});
        fs33->connect(firsta, {stimes});
        fs33->connect(seconda, {fmul});
        fs34->connect(firsta, {sdiv});
        fs34->connect(seconda, {fdiv});
        fs35->connect(arga, {fs36});
        fs36->connect(firsta, {fs37});
        fs36->connect(seconda, {fs38});

        ps4->connect(solver, {fs40});
        fs40->connect(firsta, {fs41});
        fs40->connect(seconda, {fs45});
        fs40->connect(thirda, {fs49});
        fs41->connect(arga, {fs42});
        fs42->connect(firsta, {fs43});
        fs42->connect(seconda, {fs44});
        fs43->connect(firsta, {splus});
        fs43->connect(seconda, {fadd});
        fs44->connect(firsta, {smin});
        fs44->connect(seconda, {fsub});
        fs45->connect(arga, {fs46});
        fs46->connect(firsta, {fs47});
        fs46->connect(seconda, {fs48});

        auto universe = new NS();
        /*
        auto [arithmetic, p1, p2, p3, p4] =
         universe->wrap("Arithmetic", "1+1", "2*(10-7)", "(1+2)-(3*4)", "-100/25 + 2*2*2");
        auto [hasc, hasp] =
         universe->wrap("has context", "has problem");*/
        auto [problem_context_n, solution_context_n, parser_n, solver_n] =
         universe->wrap(problem_context_g, solution_context_g, parser_g, solver_g);
        /*
        arithmetic->connect(hasc, {problem_context_n, solution_context_n});
        arithmetic->connect(hasp, {p1, p2, p3, p4});
        arithmetic->connect(parser, {parser_n});
        arithmetic->connect(solver, {solver_n});*/

        return universe;
    }